

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

StringView __thiscall Corrade::Containers::String::findOr(String *this,char character,char *fail)

{
  type begin;
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_28;
  
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_28,this);
  begin = Implementation::stringFindCharacter();
  if (begin == (type)0x0) {
    BVar1._sizePlusFlags = 0;
    BVar1._data = fail;
  }
  else {
    BVar1 = BasicStringView<const_char>::slice(&local_28,(char *)begin,(char *)(begin + 1));
  }
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findOr(const char character, const char* const fail) const {
    return StringView{*this}.findOr(character, fail);
}